

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

Cell * __thiscall
notch::io::CSVReader::parseCell(Cell *__return_storage_ptr__,CSVReader *this,string *s)

{
  allocator local_35;
  float local_34;
  char *pcStack_30;
  float value;
  char *parseEnd;
  char *parseBegin;
  string *s_local;
  CSVReader *this_local;
  
  parseBegin = (char *)s;
  s_local = (string *)this;
  this_local = (CSVReader *)__return_storage_ptr__;
  parseEnd = (char *)std::__cxx11::string::c_str();
  pcStack_30 = (char *)0x0;
  local_34 = strtof(parseEnd,&stack0xffffffffffffffd0);
  if ((pcStack_30 == parseEnd) || (pcStack_30 == (char *)0x0)) {
    __return_storage_ptr__->tag = String;
    __return_storage_ptr__->value = 0.0;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->str,(string *)parseBegin);
  }
  else {
    __return_storage_ptr__->tag = Number;
    __return_storage_ptr__->value = local_34;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&__return_storage_ptr__->str,"",&local_35);
    std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

Cell parseCell(const std::string &s) {
        // float value = std::stof(s); // doesn't work on MinGW-32; BUG #52015
        const char *parseBegin = s.c_str();
        char *parseEnd = nullptr;
        float value = strtof(parseBegin, &parseEnd);
        if (parseEnd == parseBegin || parseEnd == nullptr) {
            return Cell { CellTag::String, 0.0, s };
        } else {
            return Cell { CellTag::Number, value, "" };
        }
    }